

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O0

void __thiscall muduo::ThreadPool::stop(ThreadPool *this)

{
  bool bVar1;
  MutexLock *in_RDI;
  unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_> *thr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  *__range1;
  MutexLockGuard lock;
  Condition *in_stack_ffffffffffffffc0;
  __normal_iterator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_*,_std::vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>_>
  local_30;
  pid_t *local_28;
  
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)in_stack_ffffffffffffffc0,in_RDI);
  in_RDI[7].mutex_.__size[8] = '\0';
  Condition::notifyAll(in_stack_ffffffffffffffc0);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x150f50);
  local_28 = &in_RDI[4].holder_;
  local_30._M_current =
       (unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_> *)
       std::
       vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
       ::begin((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                *)in_RDI);
  std::
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ::end((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_*,_std::vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_*,_std::vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (Condition *)
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_*,_std::vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>_>
         ::operator*(&local_30);
    std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>::operator->
              ((unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_> *)0x150fab);
    Thread::join((Thread *)0x150fb3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_*,_std::vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void ThreadPool::stop()
{
  {
  MutexLockGuard lock(mutex_);
  running_ = false;
  notEmpty_.notifyAll();
  }
  for (auto& thr : threads_)
  {
    thr->join();
  }
}